

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.cpp
# Opt level: O1

void __thiscall tli_window_manager::TableBox::TableBox(TableBox *this,TableBox *other)

{
  long *plVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  TableBox(this,other->rows_,other->cols_);
  if (0 < this->rows_) {
    lVar5 = 0;
    do {
      if (0 < this->cols_) {
        lVar4 = 0;
        lVar3 = 0;
        do {
          plVar1 = *(long **)(*(long *)&(other->table_).
                                        super__Vector_base<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>,_std::allocator<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[lVar5].
                                        super__Vector_base<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>
                                        ._M_impl.super__Vector_impl_data + lVar4);
          if (plVar1 != (long *)0x0) {
            uVar2 = (**(code **)(*plVar1 + 0x10))();
            *(undefined8 *)
             (*(long *)&(this->table_).
                        super__Vector_base<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>,_std::allocator<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar5].
                        super__Vector_base<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>
                        ._M_impl.super__Vector_impl_data + lVar4) = uVar2;
          }
          lVar3 = lVar3 + 1;
          lVar4 = lVar4 + 0x10;
        } while (lVar3 < this->cols_);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < this->rows_);
  }
  return;
}

Assistant:

TableBox::TableBox(const TableBox &other) : TableBox(other.rows_, other.cols_) {
    for (int i = 0; i < rows_; ++i) {
        for (int j = 0; j < cols_; ++j) {
            if (other.table_[i][j].first) {
                table_[i][j].first = other.table_[i][j].first->clone();
            }
        }
    }
}